

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * google::protobuf::io::anon_unknown_1::CopyCordToArray(Cord *cord,uint8_t *target)

{
  reference rVar1;
  ChunkIterator __begin3;
  ChunkIterator local_b0;
  
  absl::lts_20250127::Cord::ChunkIterator::ChunkIterator(&local_b0,cord);
  while (local_b0.bytes_remaining_ != 0) {
    rVar1 = absl::lts_20250127::Cord::ChunkIterator::operator*(&local_b0);
    memcpy(target,rVar1._M_str,rVar1._M_len);
    target = target + rVar1._M_len;
    absl::lts_20250127::Cord::ChunkIterator::operator++(&local_b0);
  }
  return target;
}

Assistant:

inline uint8_t* CopyCordToArray(const absl::Cord& cord, uint8_t* target) {
  for (absl::string_view sv : cord.Chunks()) {
    memcpy(target, sv.data(), sv.size());
    target += sv.size();
  }
  return target;
}